

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

ego_item * lookup_ego_item(char *name,wchar_t tval,wchar_t sval)

{
  int iVar1;
  ego_item *peVar2;
  object_kind *poVar3;
  object_kind *kind;
  poss_item *poss_item;
  ego_item *ego;
  wchar_t i;
  wchar_t sval_local;
  wchar_t tval_local;
  char *name_local;
  
  ego._4_4_ = 0;
  do {
    if ((int)(uint)z_info->e_max <= ego._4_4_) {
      return (ego_item *)0x0;
    }
    peVar2 = e_info + ego._4_4_;
    kind = (object_kind *)peVar2->poss_items;
    if ((peVar2->name != (char *)0x0) && (iVar1 = strcmp(name,peVar2->name), iVar1 == 0)) {
      for (; kind != (object_kind *)0x0; kind = (object_kind *)kind->text) {
        poVar3 = lookup_kind(tval,sval);
        if (poVar3->kidx == *(uint32_t *)&kind->name) {
          return peVar2;
        }
      }
    }
    ego._4_4_ = ego._4_4_ + 1;
  } while( true );
}

Assistant:

struct ego_item *lookup_ego_item(const char *name, int tval, int sval)
{
	int i;

	/* Look for it */
	for (i = 0; i < z_info->e_max; i++) {
		struct ego_item *ego = &e_info[i];
		struct poss_item *poss_item = ego->poss_items;

		/* Reject nameless and wrong names */
		if (!ego->name) continue;
		if (!streq(name, ego->name)) continue;

		/* Check tval and sval */
		while (poss_item) {
			struct object_kind *kind = lookup_kind(tval, sval);
			if (kind->kidx == poss_item->kidx) {
				return ego;
			}
			poss_item = poss_item->next;
		}
	}

	return NULL;
}